

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLLinOp.cpp
# Opt level: O3

Box * __thiscall amrex::MLLinOp::compactify(Box *__return_storage_ptr__,MLLinOp *this,Box *b)

{
  int iVar1;
  int iVar2;
  int iVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  uint uVar6;
  undefined8 uVar7;
  
  uVar6 = (this->info).hidden_direction;
  if (2 < uVar6) {
    uVar7 = *(undefined8 *)(b->smallend).vect;
    uVar4 = *(undefined8 *)((b->smallend).vect + 2);
    uVar5 = *(undefined8 *)((b->bigend).vect + 2);
    *(undefined8 *)(__return_storage_ptr__->bigend).vect = *(undefined8 *)(b->bigend).vect;
    *(undefined8 *)((__return_storage_ptr__->bigend).vect + 2) = uVar5;
    *(undefined8 *)(__return_storage_ptr__->smallend).vect = uVar7;
    *(undefined8 *)((__return_storage_ptr__->smallend).vect + 2) = uVar4;
    return __return_storage_ptr__;
  }
  if (uVar6 != 1) {
    if (uVar6 == 0) {
      uVar6 = (b->btype).itype;
      *(undefined8 *)(__return_storage_ptr__->smallend).vect =
           *(undefined8 *)((b->smallend).vect + 1);
      (__return_storage_ptr__->smallend).vect[2] = 0;
      uVar7 = *(undefined8 *)((b->bigend).vect + 1);
    }
    else {
      uVar6 = (b->btype).itype;
      *(undefined8 *)(__return_storage_ptr__->smallend).vect = *(undefined8 *)(b->smallend).vect;
      (__return_storage_ptr__->smallend).vect[2] = 0;
      uVar7 = *(undefined8 *)(b->bigend).vect;
    }
    *(undefined8 *)(__return_storage_ptr__->bigend).vect = uVar7;
    (__return_storage_ptr__->bigend).vect[2] = 0;
    (__return_storage_ptr__->btype).itype = uVar6;
    return __return_storage_ptr__;
  }
  iVar1 = (b->smallend).vect[2];
  iVar2 = (b->bigend).vect[0];
  iVar3 = (b->bigend).vect[2];
  uVar6 = (b->btype).itype;
  (__return_storage_ptr__->smallend).vect[0] = (b->smallend).vect[0];
  (__return_storage_ptr__->smallend).vect[1] = iVar1;
  (__return_storage_ptr__->smallend).vect[2] = 0;
  (__return_storage_ptr__->bigend).vect[0] = iVar2;
  (__return_storage_ptr__->bigend).vect[1] = iVar3;
  (__return_storage_ptr__->bigend).vect[2] = 0;
  (__return_storage_ptr__->btype).itype = uVar6;
  return __return_storage_ptr__;
}

Assistant:

Box
MLLinOp::compactify (Box const& b) const noexcept
{
#if (AMREX_SPACEDIM == 3)
    if (info.hasHiddenDimension()) {
        const auto& lo = b.smallEnd();
        const auto& hi = b.bigEnd();
        if (info.hidden_direction == 0) {
            return Box(IntVect(lo[1],lo[2],0), IntVect(hi[1],hi[2],0), b.ixType());
        } else if (info.hidden_direction == 1) {
            return Box(IntVect(lo[0],lo[2],0), IntVect(hi[0],hi[2],0), b.ixType());
        } else {
            return Box(IntVect(lo[0],lo[1],0), IntVect(hi[0],hi[1],0), b.ixType());
        }
    } else
#endif
    {
        return b;
    }
}